

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

size_t mz_zip_file_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  __off64_t _Var2;
  size_t sVar3;
  long lVar4;
  long __off;
  
  _Var2 = ftello64(*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70));
  lVar4 = *(long *)((long)pOpaque + 0x68);
  __off = file_ofs + *(long *)(lVar4 + 0x78);
  if (-1 < __off) {
    if (_Var2 != __off) {
      iVar1 = fseeko64(*(FILE **)(lVar4 + 0x70),__off,0);
      if (iVar1 != 0) goto LAB_00127095;
      lVar4 = *(long *)((long)pOpaque + 0x68);
    }
    sVar3 = fwrite(pBuf,1,n,*(FILE **)(lVar4 + 0x70));
    return sVar3;
  }
LAB_00127095:
  *(undefined4 *)((long)pOpaque + 0x1c) = 0x16;
  return 0;
}

Assistant:

static size_t mz_zip_file_write_func(void* pOpaque, mz_uint64 file_ofs, const void* pBuf, size_t n) {

    mz_zip_archive* pZip = (mz_zip_archive*)pOpaque;
    mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);

    file_ofs += pZip->m_pState->m_file_archive_start_ofs;

    if (((mz_int64)file_ofs < 0) || (((cur_ofs != (mz_int64)file_ofs)) && (MZ_FSEEK64(pZip->m_pState->m_pFile,
                                                                                      (mz_int64)file_ofs,
                                                                                      SEEK_SET)))) {
        mz_zip_set_error(pZip, MZ_ZIP_FILE_SEEK_FAILED);
        return 0;
    }

    return MZ_FWRITE(pBuf, 1, n, pZip->m_pState->m_pFile);
}